

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::~DeviceContextBase
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  code *pcVar1;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~DeviceContextBase()
    {
    }